

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

void Min_CoverCheck(Min_Man_t *p)

{
  ulong uVar1;
  Min_Cube_t *pMVar2;
  
  if (-1 < p->nVars) {
    uVar1 = 0;
    do {
      pMVar2 = (Min_Cube_t *)(p->ppStore + uVar1);
      while (pMVar2 = pMVar2->pNext, pMVar2 != (Min_Cube_t *)0x0) {
        if (uVar1 != *(uint *)&pMVar2->field_0x8 >> 0x16) {
          __assert_fail("i == (int)pCube->nLits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinUtil.c"
                        ,0xe5,"void Min_CoverCheck(Min_Man_t *)");
        }
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (ulong)(uint)p->nVars + 1);
  }
  return;
}

Assistant:

void Min_CoverCheck( Min_Man_t * p )
{
    Min_Cube_t * pCube;
    int i;
    for ( i = 0; i <= p->nVars; i++ )
        Min_CoverForEachCube( p->ppStore[i], pCube )
            assert( i == (int)pCube->nLits );
}